

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

char * ktxTranscodeFormatString(ktx_transcode_fmt_e format)

{
  ktx_transcode_fmt_e format_local;
  char *local_8;
  
  switch(format) {
  case KTX_TF_ETC1:
    local_8 = "ETC1_RGB";
    break;
  case KTX_TTF_ETC2_RGBA:
    local_8 = "ETC2_RGBA";
    break;
  case KTX_TF_BC1:
    local_8 = "BC1_RGB";
    break;
  case KTX_TF_BC3:
    local_8 = "BC3_RGBA";
    break;
  case KTX_TF_BC4:
    local_8 = "BC4_R";
    break;
  case KTX_TF_BC5:
    local_8 = "BC5_RG";
    break;
  case KTX_TF_BC7_M6_OPAQUE_ONLY:
    local_8 = "BC7_RGBA";
    break;
  default:
    local_8 = "Unrecognized format";
    break;
  case KTX_TF_PVRTC1_4_OPAQUE_ONLY:
    local_8 = "PVRTC1_4_RGB";
    break;
  case KTX_TTF_PVRTC1_4_RGBA:
    local_8 = "PVRTC1_4_RGBA";
    break;
  case KTX_TTF_ASTC_4x4_RGBA:
    local_8 = "ASTC_4x4_RGBA";
    break;
  case KTX_TTF_RGBA32:
    local_8 = "RGBA32";
    break;
  case KTX_TTF_RGB565:
    local_8 = "RGB565";
    break;
  case KTX_TTF_BGR565:
    local_8 = "BGR565";
    break;
  case KTX_TTF_RGBA4444:
    local_8 = "RGBA4444";
    break;
  case KTX_TTF_PVRTC2_4_RGB:
    local_8 = "PVRTC2_4_RGB";
    break;
  case KTX_TTF_PVRTC2_4_RGBA:
    local_8 = "PVRTC2_4_RGBA";
    break;
  case KTX_TTF_ETC2_EAC_R11:
    local_8 = "ETC2_EAC_R11";
    break;
  case KTX_TTF_ETC2_EAC_RG11:
    local_8 = "ETC2_EAC_RG11";
    break;
  case KTX_TF_ETC2:
    local_8 = "ETC";
    break;
  case KTX_TTF_BC1_OR_3:
    local_8 = "BC1 or BC3";
  }
  return local_8;
}

Assistant:

const char* ktxTranscodeFormatString(ktx_transcode_fmt_e format)
{
    switch (format) {
        case KTX_TTF_ETC1_RGB: return "ETC1_RGB";
        case KTX_TTF_ETC2_RGBA: return "ETC2_RGBA";
        case KTX_TTF_BC1_RGB: return "BC1_RGB";
        case KTX_TTF_BC3_RGBA: return "BC3_RGBA";
        case KTX_TTF_BC4_R: return "BC4_R";
        case KTX_TTF_BC5_RG: return "BC5_RG";
        case KTX_TTF_BC7_RGBA: return "BC7_RGBA";
        case KTX_TTF_PVRTC1_4_RGB: return "PVRTC1_4_RGB";
        case KTX_TTF_PVRTC1_4_RGBA: return "PVRTC1_4_RGBA";
        case KTX_TTF_ASTC_4x4_RGBA: return "ASTC_4x4_RGBA";
        case KTX_TTF_RGBA32: return "RGBA32";
        case KTX_TTF_RGB565: return "RGB565";
        case KTX_TTF_BGR565: return "BGR565";
        case KTX_TTF_RGBA4444: return "RGBA4444";
        case KTX_TTF_PVRTC2_4_RGB: return "PVRTC2_4_RGB";
        case KTX_TTF_PVRTC2_4_RGBA: return "PVRTC2_4_RGBA";
        case KTX_TTF_ETC2_EAC_R11: return "ETC2_EAC_R11";
        case KTX_TTF_ETC2_EAC_RG11: return "ETC2_EAC_RG11";
        case KTX_TTF_ETC: return "ETC";
        case KTX_TTF_BC1_OR_3: return "BC1 or BC3";
        default: return "Unrecognized format";
    }
}